

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O2

SubcaseBasePtr
deqp::TestSubcase::
Create<gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength_cs_std430_matC_pad>(void)

{
  AdvancedUnsizedArrayLength2 *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (AdvancedUnsizedArrayLength2 *)operator_new(0x68);
  (this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)0x0;
  (this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
  .m_gl = (Functions *)0x0;
  (this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
  .m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
    super_CallLogWrapper.m_enableLog = 0;
  (this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.m_context =
       (Context *)0x0;
  this->m_program = 0;
  this->m_storage_buffer[0] = 0;
  this->m_storage_buffer[1] = 0;
  this->m_storage_buffer[2] = 0;
  this->m_storage_buffer[3] = 0;
  this->m_storage_buffer[4] = 0;
  this->m_storage_buffer[5] = 0;
  this->m_storage_buffer[6] = 0;
  *(undefined8 *)(this->m_storage_buffer + 7) = 0;
  this->stage = 0;
  this->etype = 0;
  this->layout = 0;
  this->other_members = false;
  *(undefined3 *)&this->field_0x5d = 0;
  this->bind_seq = 0;
  this->length_as_index = false;
  *(undefined3 *)&this->field_0x65 = 0;
  gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength2::AdvancedUnsizedArrayLength2(this);
  (this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_01dc9d30;
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}